

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstack.h
# Opt level: O1

void __thiscall
TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>::
push_back(TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *object)

{
  pointer pcVar1;
  long *local_30 [2];
  long local_20 [2];
  
  pcVar1 = (object->_M_dataplus)._M_p;
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_30,pcVar1,pcVar1 + object->_M_string_length);
  (*(this->
    super_TPZManVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
    ).super_TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._vptr_TPZVec[3])(this,(this->
                           super_TPZManVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
                           ).
                           super_TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .fNElements + 1);
  std::__cxx11::string::_M_assign
            ((string *)
             ((this->
              super_TPZManVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
              ).
              super_TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .fStore +
             (this->
             super_TPZManVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
             ).
             super_TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .fNElements + -1));
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

void push_back(const T object)
    {
        Push(object);
    }